

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void undo_build_ssa(gen_ctx_t gen_ctx)

{
  char cVar1;
  MIR_insn_t_conflict insn;
  void *pvVar2;
  undefined8 uVar3;
  void *__ptr;
  MIR_insn_t *ppMVar4;
  bb_t_conflict pbVar5;
  bb_insn_t pbVar6;
  size_t nop;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  int local_4c;
  bb_t_conflict local_48;
  bb_insn_t local_40;
  gen_ctx_t local_38;
  
  free_fake_bb_insns(gen_ctx->ssa_ctx->arg_bb_insns);
  free_fake_bb_insns(gen_ctx->ssa_ctx->undef_insns);
  pbVar5 = (gen_ctx->curr_cfg->bbs).head;
  if (pbVar5 != (bb_t_conflict)0x0) {
    local_38 = gen_ctx;
    do {
      local_48 = pbVar5;
      for (pbVar6 = (pbVar5->bb_insns).head; pbVar6 != (bb_insn_t)0x0;
          pbVar6 = (pbVar6->bb_insn_link).next) {
        insn = pbVar6->insn;
        uVar7 = *(ulong *)&insn->field_0x18 >> 0x20;
        if (uVar7 != 0) {
          nop = 0;
          local_40 = pbVar6;
LAB_001564a7:
          do {
            MIR_insn_op_mode(gen_ctx->ctx,insn,nop,&local_4c);
            if (local_4c != 0) {
              cVar1 = insn->ops[nop].field_0x8;
              if (cVar1 == '\x02') {
                __ptr = insn->ops[(int)nop].data;
                gen_ctx = local_38;
                while (local_38 = gen_ctx, __ptr != (void *)0x0) {
                  pvVar2 = *(void **)((long)__ptr + 0x20);
                  free(__ptr);
                  __ptr = pvVar2;
                  gen_ctx = local_38;
                }
                nop = nop + 1;
                if (uVar7 <= nop) break;
                goto LAB_001564a7;
              }
              if (cVar1 != '\v') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
            }
            nop = nop + 1;
          } while (nop < uVar7);
          auVar8 = vpbroadcastq_avx512f(ZEXT816(0x30));
          auVar9 = vpbroadcastq_avx512f(ZEXT816(8));
          uVar7 = *(ulong *)&insn->field_0x18 >> 0x20;
          pbVar6 = local_40;
          if (uVar7 != 0) {
            auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            uVar7 = uVar7 + 7 & 0xfffffffffffffff8;
            auVar11 = vpbroadcastq_avx512f();
            do {
              auVar12 = vpmullq_avx512dq(auVar10,auVar8);
              uVar3 = vpcmpuq_avx512f(auVar10,auVar11,2);
              auVar10 = vpaddq_avx512f(auVar10,auVar9);
              uVar7 = uVar7 - 8;
              vpscatterqq_avx512f(ZEXT864(insn->ops) + ZEXT864(0) + auVar12,uVar3,
                                  ZEXT1664((undefined1  [16])0x0));
            } while (uVar7 != 0);
          }
        }
      }
      pbVar5 = (local_48->bb_link).next;
    } while (pbVar5 != (bb_t)0x0);
    for (pbVar5 = (gen_ctx->curr_cfg->bbs).head; pbVar5 != (bb_t_conflict)0x0;
        pbVar5 = (pbVar5->bb_link).next) {
      pbVar6 = (pbVar5->bb_insns).head;
      while (pbVar6 != (bb_insn_t)0x0) {
        ppMVar4 = &pbVar6->insn;
        pbVar6 = (pbVar6->bb_insn_link).next;
        if (*(int *)&(*ppMVar4)->field_0x18 == 0xba) {
          gen_delete_insn(gen_ctx,*ppMVar4);
        }
      }
    }
  }
  return;
}

Assistant:

static void undo_build_ssa (gen_ctx_t gen_ctx) {
  bb_t bb;
  bb_insn_t bb_insn, next_bb_insn;
  ssa_edge_t se, next_se;
  int op_num;
  MIR_reg_t var;
  MIR_insn_t insn;
  insn_var_iterator_t iter;

  free_fake_bb_insns (arg_bb_insns);
  free_fake_bb_insns (undef_insns);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        /* all sse after ssa combine available only from defs */
        for (se = insn->ops[op_num].data; se != NULL; se = next_se) {
          next_se = se->next_use;
          free_ssa_edge (se);
        }
      }
      for (size_t i = 0; i < insn->nops; i++) insn->ops[i].data = NULL;
    }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
      next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
      if (bb_insn->insn->code == MIR_PHI) gen_delete_insn (gen_ctx, bb_insn->insn);
    }
}